

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte *pbVar1;
  float *pfVar2;
  char cVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  ImGuiTableInstanceData *pIVar12;
  byte bVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ImGuiTableColumn *pIVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImRect host_clip_rect;
  ImRect local_58;
  ImRect local_40;
  
  pIVar8 = GImGui;
  uVar22 = table->Flags;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  fVar25 = (pIVar8->Style).FramePadding.x;
  fVar26 = 1.0;
  if (1.0 <= fVar25) {
    fVar26 = fVar25;
  }
  table->MinColumnWidth = fVar26;
  bVar11 = false;
  if (table->ColumnsCount < 1) {
    uVar21 = 0xff;
    bVar7 = true;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar23 = 0.0;
    cVar10 = '\0';
  }
  else {
    cVar10 = '\0';
    uVar21 = 0xffffffff;
    uVar19 = 0;
    iVar15 = 0;
    bVar11 = false;
    bVar7 = false;
    fVar26 = 0.0;
    fVar25 = 0.0;
    do {
      bVar13 = (table->DisplayOrderToIndex).Data[uVar19];
      uVar16 = (uint)(char)bVar13;
      if (uVar19 != uVar16) {
        table->IsDefaultDisplayOrder = false;
      }
      pIVar17 = (table->Columns).Data + (char)bVar13;
      if (table->DeclColumnsCount <= (char)bVar13) {
        TableSetupColumnFlags(table,pIVar17,0);
        pIVar17->NameOffset = -1;
        pIVar17->UserID = 0;
        pIVar17->InitStretchWeightOrWidth = -1.0;
      }
      if (((table->Flags & 4) == 0) || ((pIVar17->Flags & 0x80) != 0)) {
        pIVar17->IsUserEnabledNextFrame = true;
      }
      if (pIVar17->IsUserEnabled != pIVar17->IsUserEnabledNextFrame) {
        pIVar17->IsUserEnabled = pIVar17->IsUserEnabledNextFrame;
        table->IsSettingsDirty = true;
      }
      bVar9 = (bool)((pIVar17->Flags & 1U) == 0 & pIVar17->IsUserEnabled);
      pIVar17->IsEnabled = bVar9;
      if ((pIVar17->SortOrder != -1) && (bVar9 == false)) {
        table->IsSortSpecsDirty = true;
      }
      if (('\0' < pIVar17->SortOrder) && ((table->Flags & 0x4000000) == 0)) {
        table->IsSortSpecsDirty = true;
      }
      if ((&pIVar17->WidthRequest)[(ulong)((pIVar17->Flags & 0x10) == 0) * 2] <= 0.0 &&
          (&pIVar17->WidthRequest)[(ulong)((pIVar17->Flags & 0x10) == 0) * 2] != 0.0) {
        pIVar17->AutoFitQueue = '\a';
        pIVar17->CannotSkipItemsQueue = '\a';
      }
      if (pIVar17->IsEnabled == false) {
        pIVar17->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar17->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar21;
        pIVar17->NextEnabledColumn = -1;
        if (uVar21 == 0xffffffff) {
          table->LeftMostEnabledColumn = bVar13;
        }
        else {
          (table->Columns).Data[(int)uVar21].NextEnabledColumn = bVar13;
        }
        cVar3 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar3 + '\x01';
        pIVar17->IndexWithinEnabledSet = cVar3;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar13 & 0x3f);
        table->EnabledMaskByDisplayOrder =
             table->EnabledMaskByDisplayOrder | 1L << (pIVar17->DisplayOrder & 0x3fU);
        if (pIVar17->IsPreserveWidthAuto == false) {
          fVar23 = TableGetColumnWidthAuto(table,pIVar17);
          pIVar17->WidthAuto = fVar23;
        }
        uVar21 = pIVar17->Flags;
        if ((uVar21 & 0x20) == 0) {
          bVar7 = true;
        }
        if ((((uVar21 & 0x10) != 0) && ((uVar21 & 0x20) != 0)) &&
           (0.0 < pIVar17->InitStretchWeightOrWidth)) {
          pIVar17->WidthAuto = pIVar17->InitStretchWeightOrWidth;
        }
        if (pIVar17->AutoFitQueue != '\0') {
          bVar11 = true;
        }
        fVar23 = pIVar17->WidthAuto;
        uVar21 = uVar16;
        if ((pIVar17->Flags & 8) == 0) {
          fVar25 = (float)((uint)fVar25 & -(uint)(fVar23 <= fVar25) |
                          ~-(uint)(fVar23 <= fVar25) & (uint)fVar23);
          cVar10 = cVar10 + '\x01';
        }
        else {
          fVar26 = fVar26 + fVar23;
          iVar15 = iVar15 + 1;
        }
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)table->ColumnsCount);
    fVar23 = (float)iVar15;
    bVar7 = !bVar7;
  }
  uVar22 = uVar22 & 0xe000;
  if ((((table->Flags & 8U) != 0) && (((uint)table->Flags >> 0x1b & 1) == 0)) &&
     (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar21;
  if (bVar11) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  if (table->ColumnsCount < 1) {
    fVar24 = 0.0;
    fVar27 = 0.0;
  }
  else {
    lVar14 = 99;
    uVar19 = 0;
    fVar27 = 0.0;
    fVar24 = 0.0;
    do {
      bVar13 = (byte)uVar19;
      if ((table->EnabledMaskByIndex >> (uVar19 & 0x3f) & 1) != 0) {
        pIVar17 = (table->Columns).Data;
        uVar21 = *(uint *)((long)pIVar17 + lVar14 + -99);
        if ((uVar21 & 0x10) == 0) {
          if ((((uVar21 & 0x20) != 0) || (*(char *)((long)&pIVar17->Flags + lVar14) != '\0')) ||
             (pfVar2 = (float *)((long)pIVar17 + lVar14 + -0x4b), *pfVar2 <= 0.0 && *pfVar2 != 0.0))
          {
            fVar28 = *(float *)((long)pIVar17 + lVar14 + -0x47);
            bVar11 = fVar28 <= 0.0;
            if (fVar28 <= 0.0) {
              fVar28 = 1.0;
            }
            if (bVar11 && uVar22 == 0x6000) {
              fVar28 = (*(float *)((long)pIVar17 + lVar14 + -0x4f) / fVar26) * fVar23;
            }
            *(float *)((long)pIVar17 + lVar14 + -0x4b) = fVar28;
          }
          fVar24 = fVar24 + *(float *)((long)pIVar17 + lVar14 + -0x4b);
          if (((long)table->LeftMostStretchedColumn == -1) ||
             (*(char *)((long)pIVar17 + lVar14 + -0x11) <
              (table->Columns).Data[table->LeftMostStretchedColumn].DisplayOrder)) {
            table->LeftMostStretchedColumn = bVar13;
          }
          if (((long)table->RightMostStretchedColumn == -1) ||
             ((table->Columns).Data[table->RightMostStretchedColumn].DisplayOrder <
              *(char *)((long)pIVar17 + lVar14 + -0x11))) {
            table->RightMostStretchedColumn = bVar13;
          }
        }
        else {
          fVar28 = *(float *)((long)pIVar17 + lVar14 + -0x4f);
          if ((uVar22 == 0x4000) &&
             (((uVar21 & 0x20) != 0 || (*(char *)((long)&pIVar17->Flags + lVar14) != '\0')))) {
            fVar28 = fVar25;
          }
          if ((*(char *)((long)&pIVar17->Flags + lVar14) != '\0') ||
             (((uVar21 & 0x20) != 0 &&
              ((table->RequestOutputMaskByIndex & 1L << (bVar13 & 0x3f)) != 0)))) {
            *(float *)((long)pIVar17 + lVar14 + -0x53) = fVar28;
          }
          if (((1 < *(byte *)((long)&pIVar17->Flags + lVar14)) && (table->IsInitializing == true))
             && (*(char *)((long)pIVar17 + lVar14 + -2) == '\0')) {
            fVar28 = *(float *)((long)pIVar17 + lVar14 + -0x53);
            fVar29 = table->MinColumnWidth * 4.0;
            uVar21 = -(uint)(fVar29 <= fVar28);
            *(uint *)((long)pIVar17 + lVar14 + -0x53) =
                 ~uVar21 & (uint)fVar29 | (uint)fVar28 & uVar21;
          }
          fVar27 = fVar27 + *(float *)((long)pIVar17 + lVar14 + -0x53);
        }
        *(undefined1 *)((long)pIVar17 + lVar14 + -2) = 0;
        fVar27 = fVar27 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar19 = uVar19 + 1;
      lVar14 = lVar14 + 0x68;
    } while ((long)uVar19 < (long)table->ColumnsCount);
  }
  table->ColumnsEnabledFixedCount = cVar10;
  table->ColumnsStretchSumWeights = fVar24;
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((table->Flags & 0x1000000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar23 = (table->WorkRect).Max.x - fVar25;
  }
  else {
    fVar23 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar28 = (table->WorkRect).Min.y;
  fVar27 = (fVar23 - fVar26) - fVar27;
  table->ColumnsGivenWidth =
       (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) + fVar26
  ;
  uVar22 = table->ColumnsCount;
  fVar26 = fVar27;
  if (0 < (int)uVar22) {
    lVar14 = 0;
    uVar19 = 0;
    do {
      if ((table->EnabledMaskByIndex >> (uVar19 & 0x3f) & 1) != 0) {
        pIVar17 = (table->Columns).Data;
        if ((*(byte *)((long)&pIVar17->Flags + lVar14) & 8) != 0) {
          fVar23 = (*(float *)((long)&pIVar17->StretchWeight + lVar14) / fVar24) * fVar27;
          uVar22 = -(uint)(table->MinColumnWidth <= fVar23);
          fVar23 = (float)(int)((float)(~uVar22 & (uint)table->MinColumnWidth |
                                       (uint)fVar23 & uVar22) + 0.01);
          *(float *)((long)&pIVar17->WidthRequest + lVar14) = fVar23;
          fVar26 = fVar26 - fVar23;
        }
        if (((&pIVar17->NextEnabledColumn)[lVar14] == -1) && (table->LeftMostStretchedColumn != -1))
        {
          pbVar1 = (byte *)((long)&pIVar17->Flags + lVar14 + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        fVar23 = *(float *)((long)&pIVar17->WidthRequest + lVar14);
        uVar22 = -(uint)(table->MinColumnWidth <= fVar23);
        fVar23 = (float)(int)(float)(~uVar22 & (uint)table->MinColumnWidth | (uint)fVar23 & uVar22);
        *(float *)((long)&pIVar17->WidthGiven + lVar14) = fVar23;
        table->ColumnsGivenWidth = fVar23 + table->ColumnsGivenWidth;
      }
      uVar19 = uVar19 + 1;
      uVar22 = table->ColumnsCount;
      lVar14 = lVar14 + 0x68;
    } while ((long)uVar19 < (long)(int)uVar22);
  }
  if (((1.0 <= fVar26) && ((table->Flags & 0x80000) == 0)) &&
     ((1.0 <= fVar26 && ((0 < (int)uVar22 && (0.0 < fVar24)))))) {
    uVar19 = (ulong)uVar22;
    do {
      if ((table->EnabledMaskByDisplayOrder >> ((ulong)((int)uVar19 - 1U & 0xff) & 0x3f) & 1) != 0)
      {
        pIVar17 = (table->Columns).Data;
        cVar10 = (table->DisplayOrderToIndex).Data[uVar19 - 1];
        if ((pIVar17[cVar10].Flags & 8) != 0) {
          pIVar17[cVar10].WidthRequest = pIVar17[cVar10].WidthRequest + 1.0;
          pIVar17[cVar10].WidthGiven = pIVar17[cVar10].WidthGiven + 1.0;
          fVar26 = fVar26 + -1.0;
        }
      }
    } while (((0.0 < fVar24) && (1.0 <= fVar26)) &&
            (bVar11 = 1 < (long)uVar19, uVar19 = uVar19 - 1, bVar11));
  }
  if ((long)table->InstanceCurrent == 0) {
    pIVar12 = &table->InstanceDataFirst;
  }
  else {
    pIVar12 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar26 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar23 = local_40.Min.y + pIVar12->LastOuterHeight;
  uVar22 = -(uint)(fVar23 <= fVar26);
  local_40.Max.y = (float)(uVar22 & (uint)fVar26 | ~uVar22 & (uint)fVar23);
  IVar4 = pIVar8->ActiveId;
  pIVar8->ActiveId = 0;
  bVar9 = ItemHoverable(&local_40,0);
  pIVar8->ActiveId = IVar4;
  bVar11 = '\0' < table->FreezeColumnsCount;
  fVar26 = fVar25;
  if ('\0' < table->FreezeColumnsCount) {
    fVar26 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar19 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    fVar26 = (fVar26 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar18 = 0;
    iVar15 = 0;
    do {
      bVar13 = (table->DisplayOrderToIndex).Data[uVar18];
      bVar20 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar20 = (char)bVar13 < table->FreezeColumnsCount;
      }
      pIVar17 = (table->Columns).Data + (char)bVar13;
      pIVar17->NavLayerCurrent = bVar20;
      if ((bVar11) && (iVar15 == table->FreezeColumnsCount)) {
        fVar26 = fVar26 + (fVar25 - (table->OuterRect).Min.x);
        bVar11 = false;
      }
      pbVar1 = (byte *)((long)&pIVar17->Flags + 3);
      *pbVar1 = *pbVar1 & 0xf0;
      if ((table->EnabledMaskByDisplayOrder >> (uVar18 & 0x3f) & 1) == 0) {
        (pIVar17->ClipRect).Max.x = fVar26;
        (pIVar17->ClipRect).Min.x = fVar26;
        pIVar17->WorkMinX = fVar26;
        pIVar17->MaxX = fVar26;
        pIVar17->MinX = fVar26;
        pIVar17->WidthGiven = 0.0;
        (pIVar17->ClipRect).Min.y = fVar28;
        (pIVar17->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar17->ClipRect,&local_58);
        pIVar17->IsVisibleX = false;
        pIVar17->IsVisibleY = false;
        pIVar17->IsRequestOutput = false;
        pIVar17->IsSkipItems = true;
        pIVar17->ItemWidth = 1.0;
      }
      else {
        if (((bVar9) && (fVar23 = (pIVar8->IO).MousePos.x, (pIVar17->ClipRect).Min.x <= fVar23)) &&
           (fVar23 < (pIVar17->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar13;
        }
        pIVar17->MinX = fVar26;
        fVar24 = TableGetMaxColumnWidth(table,(int)(char)bVar13);
        fVar23 = pIVar17->WidthGiven;
        if (fVar24 <= pIVar17->WidthGiven) {
          fVar23 = fVar24;
        }
        pIVar17->WidthGiven = fVar23;
        fVar24 = pIVar17->WidthRequest;
        if (table->MinColumnWidth <= pIVar17->WidthRequest) {
          fVar24 = table->MinColumnWidth;
        }
        fVar23 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                        (uint)fVar23 & -(uint)(fVar24 <= fVar23));
        pIVar17->WidthGiven = fVar23;
        fVar24 = table->CellPaddingX + table->CellPaddingX +
                 fVar23 + fVar26 + table->CellSpacingX1 + table->CellSpacingX2;
        pIVar17->MaxX = fVar24;
        pIVar17->WorkMinX = table->CellPaddingX + fVar26 + table->CellSpacingX1;
        pIVar17->WorkMaxX = (fVar24 - table->CellPaddingX) - table->CellSpacingX2;
        pIVar17->ItemWidth = (float)(int)(fVar23 * 0.65);
        (pIVar17->ClipRect).Min.x = fVar26;
        (pIVar17->ClipRect).Min.y = fVar28;
        (pIVar17->ClipRect).Max.x = fVar24;
        (pIVar17->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar17->ClipRect,&local_58);
        fVar23 = (pIVar17->ClipRect).Min.x;
        fVar24 = (pIVar17->ClipRect).Max.x;
        pIVar17->IsVisibleX = fVar23 < fVar24;
        pIVar17->IsVisibleY = true;
        if (fVar24 <= fVar23) {
          if (pIVar17->AutoFitQueue != '\0') goto LAB_002347b0;
          bVar20 = pIVar17->CannotSkipItemsQueue != '\0';
          pIVar17->IsRequestOutput = bVar20;
          if (bVar20) goto LAB_002347bb;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar13 & 0x3f);
LAB_002347b0:
          pIVar17->IsRequestOutput = true;
LAB_002347bb:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar13 & 0x3f);
        }
        bVar20 = true;
        if (pIVar17->IsEnabled == true) {
          bVar20 = table->HostSkipItems;
        }
        pIVar17->IsSkipItems = bVar20;
        uVar22 = (uint)(fVar23 < fVar24) << 0x19 | pIVar17->Flags;
        pIVar17->Flags = uVar22 | 0x1000000;
        if (pIVar17->SortOrder != -1) {
          pIVar17->Flags = uVar22 | 0x5000000;
        }
        if (table->HoveredColumnBody == bVar13) {
          pbVar1 = (byte *)((long)&pIVar17->Flags + 3);
          *pbVar1 = *pbVar1 | 8;
        }
        fVar23 = pIVar17->WorkMinX;
        pIVar17->ContentMaxXFrozen = fVar23;
        pIVar17->ContentMaxXUnfrozen = fVar23;
        pIVar17->ContentMaxXHeadersUsed = fVar23;
        pIVar17->ContentMaxXHeadersIdeal = fVar23;
        if (table->HostSkipItems == false) {
          pIVar17->AutoFitQueue = pIVar17->AutoFitQueue >> 1;
          pIVar17->CannotSkipItemsQueue = pIVar17->CannotSkipItemsQueue >> 1;
        }
        if (iVar15 < table->FreezeColumnsCount) {
          fVar24 = pIVar17->MaxX + 1.0;
          fVar23 = local_58.Max.x;
          if (fVar24 <= local_58.Max.x) {
            fVar23 = fVar24;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar24 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar24 < local_58.Min.x) & (uint)fVar23);
        }
        fVar26 = fVar26 + table->CellPaddingX + table->CellPaddingX +
                          pIVar17->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar15 = iVar15 + 1;
      }
      uVar18 = uVar18 + 1;
      uVar19 = (ulong)table->ColumnsCount;
    } while ((long)uVar18 < (long)uVar19);
  }
  fVar25 = (table->WorkRect).Min.x;
  fVar26 = (table->Columns).Data[table->RightMostEnabledColumn].ClipRect.Max.x;
  uVar22 = -(uint)(fVar26 <= fVar25);
  fVar25 = (float)(uVar22 & (uint)fVar25 | ~uVar22 & (uint)fVar26);
  if (((bVar9) && (table->HoveredColumnBody == -1)) && (fVar25 <= (pIVar8->IO).MousePos.x)) {
    table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar19;
  }
  if ((bVar7) && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  if (table->RightMostStretchedColumn != -1) {
    pbVar1 = (byte *)((long)&table->Flags + 2);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((table->Flags & 0x10000) != 0) {
    (table->WorkRect).Max.x = fVar25;
    (table->OuterRect).Max.x = fVar25;
    fVar26 = (table->InnerClipRect).Max.x;
    if (fVar25 <= fVar26) {
      fVar26 = fVar25;
    }
    (table->InnerClipRect).Max.x = fVar26;
  }
  pIVar5 = table->InnerWindow;
  IVar6 = (table->WorkRect).Max;
  (pIVar5->ParentWorkRect).Min = (table->WorkRect).Min;
  (pIVar5->ParentWorkRect).Max = IVar6;
  fVar25 = (table->InnerClipRect).Max.x;
  table->BorderX1 = (table->InnerClipRect).Min.x;
  table->BorderX2 = fVar25;
  TableSetupDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  pIVar12->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  bVar11 = TableBeginContextMenuPopup(table);
  if (bVar11) {
    TableDrawContextMenu(table);
    EndPopup();
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  pIVar5 = table->InnerWindow;
  if ((table->Flags & 0x100000) == 0) {
    ImDrawList::PushClipRect(pIVar5->DrawList,&(pIVar5->ClipRect).Min,&(pIVar5->ClipRect).Max,false)
    ;
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,2);
  }
  return;
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings and sort specs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsUserEnabledNextFrame = true;
        if (column->IsUserEnabled != column->IsUserEnabledNextFrame)
        {
            column->IsUserEnabled = column->IsUserEnabledNextFrame;
            table->IsSettingsDirty = true;
        }
        column->IsEnabled = column->IsUserEnabled && (column->Flags & ImGuiTableColumnFlags_Disabled) == 0;

        if (column->SortOrder != -1 && !column->IsEnabled)
            table->IsSortSpecsDirty = true;
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto;

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;
    table->ColumnsStretchSumWeights = stretch_sum_weights;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Determine if table is hovered which will be used to flag columns as hovered.
    // - In principle we'd like to use the equivalent of IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem),
    //   but because our item is partially submitted at this point we use ItemHoverable() and a workaround (temporarily
    //   clear ActiveId, which is equivalent to the change provided by _AllowWhenBLockedByActiveItem).
    // - This allows columns to be marked as hovered when e.g. clicking a button inside the column, or using drag and drop.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table_instance->LastOuterHeight));
    const ImGuiID backup_active_id = g.ActiveId;
    g.ActiveId = 0;
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);
    g.ActiveId = backup_active_id;

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table_instance->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (TableBeginContextMenuPopup(table))
    {
        TableDrawContextMenu(table);
        EndPopup();
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter->SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}